

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int getEndIslands(EndIsland *islands,int mc,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  int x_00;
  int iVar2;
  int iVar3;
  Xoroshiro *xr_00;
  int in_ECX;
  int in_ESI;
  StructureConfig *in_RDI;
  int in_R8D;
  float fVar4;
  int unaff_retaddr;
  int second_1;
  int second;
  float r;
  Xoroshiro xr;
  uint64_t rng;
  int z;
  int x;
  StructureConfig sconf;
  float local_5c;
  uint32_t in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd4;
  int in_stack_fffffffffffffffc;
  
  iVar1 = getStructureConfig(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = in_ECX << 4;
    x_00 = in_R8D << 4;
    xr_00 = (Xoroshiro *)
            getPopulationSeed((int)in_stack_ffffffffffffffd4,
                              CONCAT44(in_stack_ffffffffffffffcc,iVar1),x_00,
                              in_stack_ffffffffffffffc0);
    if (in_ESI < 0x15) {
      setSeed((uint64_t *)&stack0xffffffffffffffb8,
              (long)&xr_00->lo + (long)in_stack_ffffffffffffffcc);
      iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
      if (iVar2 == 0) {
        iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        in_RDI->salt = iVar2 + iVar1;
        iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        *(int *)&in_RDI->regionSize = iVar2 + 0x37;
        iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        in_RDI->rarity = (float)(iVar2 + x_00);
        iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        if (iVar2 == 0) {
          iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[1].regionSize = iVar2 + iVar1;
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[1].rarity = (float)(iVar1 + 0x37);
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[2].salt = iVar1 + x_00;
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[1].salt = iVar1 + 4;
          for (local_5c = (float)in_RDI[1].salt; 0.5 < local_5c;
              local_5c = local_5c - ((float)iVar1 + 0.5)) {
            iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          }
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[2].regionSize = iVar1 + 4;
          iVar1 = 2;
        }
        else {
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[1].salt = iVar1 + 4;
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 0;
      }
    }
    else if (in_ESI < 0x16) {
      setSeed((uint64_t *)&stack0xffffffffffffffb8,
              (long)&xr_00->lo + (long)in_stack_ffffffffffffffcc);
      fVar4 = nextFloat((uint64_t *)0x1068e1);
      if (fVar4 < in_stack_ffffffffffffffd4) {
        iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        iVar3 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        in_RDI->salt = iVar3 + iVar1;
        iVar3 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        in_RDI->rarity = (float)(iVar3 + x_00);
        iVar3 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        *(int *)&in_RDI->regionSize = iVar3 + 0x37;
        iVar3 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        in_RDI[1].salt = iVar3 + 4;
        for (local_5c = (float)in_RDI[1].salt; 0.5 < local_5c;
            local_5c = local_5c - ((float)iVar3 + 0.5)) {
          iVar3 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
        }
        if (iVar2 == 0) {
          iVar2 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[1].regionSize = iVar2 + iVar1;
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[2].salt = iVar1 + x_00;
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          in_RDI[1].rarity = (float)(iVar1 + 0x37);
          iVar1 = nextInt(&xr_00->lo,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[2].regionSize = iVar1 + 4;
          iVar1 = 2;
        }
        else {
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 0;
      }
    }
    else {
      xSetSeed((Xoroshiro *)&stack0xffffffffffffffa8,
               (long)&xr_00->lo + (long)in_stack_ffffffffffffffcc);
      fVar4 = xNextFloat((Xoroshiro *)0x106a9b);
      if (fVar4 < in_stack_ffffffffffffffd4) {
        iVar2 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
        iVar3 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
        in_RDI->salt = iVar3 + iVar1;
        iVar3 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
        in_RDI->rarity = (float)(iVar3 + x_00);
        iVar3 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
        *(int *)&in_RDI->regionSize = iVar3 + 0x37;
        iVar3 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
        in_RDI[1].salt = iVar3 + 4;
        if (iVar2 == 3) {
          for (local_5c = (float)in_RDI[1].salt; 0.5 < local_5c;
              local_5c = local_5c - ((float)iVar2 + 0.5)) {
            iVar2 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
          }
          iVar2 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[1].regionSize = iVar2 + iVar1;
          iVar1 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
          in_RDI[2].salt = iVar1 + x_00;
          iVar1 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
          in_RDI[1].rarity = (float)(iVar1 + 0x37);
          iVar1 = xNextIntJ(xr_00,in_stack_ffffffffffffffb4);
          *(int *)&in_RDI[2].regionSize = iVar1 + 4;
          iVar1 = 2;
        }
        else {
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int getEndIslands(EndIsland islands[2], int mc, uint64_t seed, int chunkX, int chunkZ)
{
    StructureConfig sconf;
    if (!getStructureConfig(End_Island, mc, &sconf))
        return 0;

    int x = chunkX * 16;
    int z = chunkZ * 16;
    uint64_t rng = getPopulationSeed(mc, seed, x, z);
    Xoroshiro xr;
    float r;

    if (mc <= MC_1_16)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextInt(&rng, (int)sconf.rarity) != 0)
            return 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].z = nextInt(&rng, 16) + z;
        if (nextInt(&rng, 4) != 0)
        {
            islands[0].r = nextInt(&rng, 3) + 4;
            return 1;
        }
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else if (mc <= MC_1_17)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextFloat(&rng) >= sconf.rarity)
            return 0;
        int second = nextInt(&rng, 4) == 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].z = nextInt(&rng, 16) + z;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        if (!second)
            return 1;
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else
    {
        xSetSeed(&xr, rng + sconf.salt);
        if (xNextFloat(&xr) >= sconf.rarity)
            return 0;
        int second = (xNextIntJ(&xr, 4) == 3);
        islands[0].x = xNextIntJ(&xr, 16) + x;
        islands[0].z = xNextIntJ(&xr, 16) + z;
        islands[0].y = xNextIntJ(&xr, 16) + 55;
        islands[0].r = xNextIntJ(&xr, 3) + 4;
        if (!second)
            return 1;
        for (r = islands[0].r; r > 0.5; r -= xNextIntJ(&xr, 2) + 0.5);
        islands[1].x = xNextIntJ(&xr, 16) + x;
        islands[1].z = xNextIntJ(&xr, 16) + z;
        islands[1].y = xNextIntJ(&xr, 16) + 55;
        islands[1].r = xNextIntJ(&xr, 3) + 4;
        return 2;
    }
}